

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring.cpp
# Opt level: O2

void duckdb::BitStringFun::GetFunctions(void)

{
  BaseScalarFunction *pBVar1;
  ScalarFunctionSet *in_RDI;
  long lVar2;
  ScalarFunction *func;
  BaseScalarFunction *function;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  allocator_type local_429;
  LogicalType local_428 [24];
  LogicalType local_410 [24];
  _Function_base local_3f8;
  code *local_3e0;
  _Function_base local_3d8;
  code *local_3c0;
  LogicalType local_3b8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3a0;
  LogicalType local_388 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_370;
  LogicalType local_358 [24];
  LogicalType local_340 [24];
  ScalarFunction local_328;
  ScalarFunction local_200;
  BaseScalarFunction local_d8 [176];
  
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::LogicalType(local_428,VARCHAR);
  duckdb::LogicalType::LogicalType(local_410,INTEGER);
  __l._M_len = 2;
  __l._M_array = local_428;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_370,__l,&local_429);
  duckdb::LogicalType::LogicalType(local_388,BIT);
  local_3d8._M_functor._8_8_ = 0;
  local_3d8._M_functor._M_unused._M_object = BitStringFunction<true>;
  local_3c0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_3d8._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_340,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_200,&local_370,local_388,&local_3d8,0,0,0,0,local_340,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_200);
  ScalarFunction::~ScalarFunction(&local_200);
  duckdb::LogicalType::~LogicalType(local_340);
  std::_Function_base::~_Function_base(&local_3d8);
  duckdb::LogicalType::~LogicalType(local_388);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_370);
  lVar2 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_428 + lVar2);
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  duckdb::LogicalType::LogicalType(local_428,BIT);
  duckdb::LogicalType::LogicalType(local_410,INTEGER);
  __l_00._M_len = 2;
  __l_00._M_array = local_428;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_3a0,__l_00,&local_429);
  duckdb::LogicalType::LogicalType(local_3b8,BIT);
  local_3f8._M_functor._8_8_ = 0;
  local_3f8._M_functor._M_unused._M_object = BitStringFunction<false>;
  local_3e0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_3f8._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_358,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_328,&local_3a0,local_3b8,&local_3f8,0,0,0,0,local_358,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_328);
  ScalarFunction::~ScalarFunction(&local_328);
  duckdb::LogicalType::~LogicalType(local_358);
  std::_Function_base::~_Function_base(&local_3f8);
  duckdb::LogicalType::~LogicalType(local_3b8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3a0);
  lVar2 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_428 + lVar2);
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  pBVar1 = *(BaseScalarFunction **)(in_RDI + 0x28);
  for (function = *(BaseScalarFunction **)(in_RDI + 0x20); function != pBVar1;
      function = function + 0x128) {
    BaseScalarFunction::SetReturnsError(local_d8,function);
    duckdb::BaseScalarFunction::~BaseScalarFunction(local_d8);
  }
  return;
}

Assistant:

ScalarFunctionSet BitStringFun::GetFunctions() {
	ScalarFunctionSet bitstring;
	bitstring.AddFunction(
	    ScalarFunction({LogicalType::VARCHAR, LogicalType::INTEGER}, LogicalType::BIT, BitStringFunction<true>));
	bitstring.AddFunction(
	    ScalarFunction({LogicalType::BIT, LogicalType::INTEGER}, LogicalType::BIT, BitStringFunction<false>));
	for (auto &func : bitstring.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return bitstring;
}